

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ins_ekf_utilities.cpp
# Opt level: O3

Vector4d * ins_ekf::QuatMultiply(Vector4d *q,Vector4d *p)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  Vector4d *quat;
  Vector4d *in_RDI;
  
  dVar2 = (p->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar3 = (p->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar4 = (p->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar5 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [0];
  dVar6 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [1];
  dVar7 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [2];
  dVar8 = (q->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  dVar1 = (p->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array
          [3];
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[0] =
       dVar5 * dVar1 + -dVar6 * dVar4 + dVar8 * dVar2 + dVar7 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[1] =
       dVar6 * dVar1 + dVar5 * dVar4 + -dVar7 * dVar2 + dVar8 * dVar3;
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[2] =
       dVar1 * dVar7 + dVar4 * dVar8 + (dVar6 * dVar2 - dVar3 * dVar5);
  (in_RDI->super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>).m_storage.m_data.array[3] =
       dVar1 * dVar8 + dVar4 * -dVar7 + (-dVar5 * dVar2 - dVar3 * dVar6);
  return in_RDI;
}

Assistant:

Eigen::Vector4d QuatMultiply(const Eigen::Vector4d& q, const Eigen::Vector4d& p){

        Eigen::Vector4d quat;

        quat[0] = q[3]*p[0] + q[2]*p[1] - q[1]*p[2] + q[0]*p[3];
        quat[1] = -q[2]*p[0] + q[3]*p[1] + q[0]*p[2] + q[1]*p[3];
        quat[2] = q[1]*p[0] - q[0]*p[1] + q[3]*p[2] + q[2]*p[3];
        quat[3] = -q[0]*p[0] - q[1]*p[1] - q[2]*p[2] + q[3]*p[3];

        return quat;
    }